

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O3

void __thiscall
btSpatialMotionVector::cross<btSpatialMotionVector>
          (btSpatialMotionVector *this,btSpatialMotionVector *b,btSpatialMotionVector *out)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  fVar1 = (b->m_topVec).m_floats[0];
  fVar2 = (this->m_topVec).m_floats[0];
  uVar3 = *(undefined8 *)((this->m_topVec).m_floats + 1);
  uVar4 = *(undefined8 *)((b->m_topVec).m_floats + 1);
  fVar7 = (float)uVar3;
  fVar8 = (float)((ulong)uVar3 >> 0x20);
  fVar9 = (float)uVar4;
  fVar10 = (float)((ulong)uVar4 >> 0x20);
  auVar5._4_4_ = fVar1 * fVar8 - fVar2 * fVar10;
  auVar5._0_4_ = fVar10 * fVar7 - fVar8 * fVar9;
  auVar5._8_4_ = fVar2 * fVar9 - fVar1 * fVar7;
  auVar5._12_4_ = 0;
  *(undefined1 (*) [16])(out->m_topVec).m_floats = auVar5;
  fVar1 = (b->m_topVec).m_floats[0];
  fVar2 = (this->m_bottomVec).m_floats[0];
  fVar7 = (b->m_bottomVec).m_floats[0];
  fVar8 = (this->m_topVec).m_floats[0];
  uVar3 = *(undefined8 *)((this->m_bottomVec).m_floats + 1);
  fVar11 = (float)uVar3;
  fVar13 = (float)((ulong)uVar3 >> 0x20);
  uVar3 = *(undefined8 *)((b->m_topVec).m_floats + 1);
  fVar15 = (float)uVar3;
  fVar16 = (float)((ulong)uVar3 >> 0x20);
  uVar3 = *(undefined8 *)((this->m_topVec).m_floats + 1);
  uVar4 = *(undefined8 *)((b->m_bottomVec).m_floats + 1);
  fVar12 = (float)uVar4;
  fVar14 = (float)((ulong)uVar4 >> 0x20);
  fVar9 = (float)uVar3;
  fVar10 = (float)((ulong)uVar3 >> 0x20);
  auVar6._4_4_ = (fVar7 * fVar10 - fVar8 * fVar14) + (fVar1 * fVar13 - fVar2 * fVar16);
  auVar6._0_4_ = (fVar14 * fVar9 - fVar10 * fVar12) + (fVar16 * fVar11 - fVar13 * fVar15);
  auVar6._8_4_ = (fVar8 * fVar12 - fVar7 * fVar9) + (fVar2 * fVar15 - fVar1 * fVar11);
  auVar6._12_4_ = 0;
  *(undefined1 (*) [16])(out->m_bottomVec).m_floats = auVar6;
  return;
}

Assistant:

SIMD_FORCE_INLINE btVector3 cross(const btVector3& v) const
	{
#if defined(BT_USE_SSE_IN_API) && defined (BT_USE_SSE)
		__m128	T, V;

		T = bt_pshufd_ps(mVec128, BT_SHUFFLE(1, 2, 0, 3));	//	(Y Z X 0)
		V = bt_pshufd_ps(v.mVec128, BT_SHUFFLE(1, 2, 0, 3));	//	(Y Z X 0)

		V = _mm_mul_ps(V, mVec128);
		T = _mm_mul_ps(T, v.mVec128);
		V = _mm_sub_ps(V, T);

		V = bt_pshufd_ps(V, BT_SHUFFLE(1, 2, 0, 3));
		return btVector3(V);
#elif defined(BT_USE_NEON)
		float32x4_t T, V;
		// form (Y, Z, X, _) of mVec128 and v.mVec128
		float32x2_t Tlow = vget_low_f32(mVec128);
		float32x2_t Vlow = vget_low_f32(v.mVec128);
		T = vcombine_f32(vext_f32(Tlow, vget_high_f32(mVec128), 1), Tlow);
		V = vcombine_f32(vext_f32(Vlow, vget_high_f32(v.mVec128), 1), Vlow);

		V = vmulq_f32(V, mVec128);
		T = vmulq_f32(T, v.mVec128);
		V = vsubq_f32(V, T);
		Vlow = vget_low_f32(V);
		// form (Y, Z, X, _);
		V = vcombine_f32(vext_f32(Vlow, vget_high_f32(V), 1), Vlow);
		V = (float32x4_t)vandq_s32((int32x4_t)V, btvFFF0Mask);

		return btVector3(V);
#else
		return btVector3(
			m_floats[1] * v.m_floats[2] - m_floats[2] * v.m_floats[1],
			m_floats[2] * v.m_floats[0] - m_floats[0] * v.m_floats[2],
			m_floats[0] * v.m_floats[1] - m_floats[1] * v.m_floats[0]);
#endif
	}